

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O0

void __thiscall juzzlin::SimpleLogger::Impl::prefixWithLevelAndTag(Impl *this,Level level)

{
  mapped_type *pmVar1;
  ostream *poVar2;
  ulong uVar3;
  long in_RDI;
  bool bVar4;
  char *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> local_65 [5];
  allocator<char> *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  byte bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  string local_30 [48];
  
  pmVar1 = std::
           map<juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<juzzlin::SimpleLogger::Level>,_std::allocator<std::pair<const_juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<juzzlin::SimpleLogger::Level>,_std::allocator<std::pair<const_juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffffb0,
                        (key_type *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  poVar2 = std::operator<<((ostream *)(in_RDI + 0x30),(string *)pmVar1);
  uVar3 = std::__cxx11::string::empty();
  bVar5 = 0;
  bVar4 = (uVar3 & 1) != 0;
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)CONCAT17(bVar5,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa0);
  }
  else {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffb0;
    std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    bVar5 = 1;
    std::operator+(__lhs,in_stack_ffffffffffffff70);
  }
  poVar2 = std::operator<<(poVar2,local_30);
  std::operator<<(poVar2," ");
  std::__cxx11::string::~string(local_30);
  if (bVar4) {
    std::allocator<char>::~allocator(local_65);
  }
  if ((bVar5 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  return;
}

Assistant:

void SimpleLogger::Impl::prefixWithLevelAndTag(SimpleLogger::Level level)
{
    m_message << m_symbols[level] << (!m_tag.empty() ? " " + m_tag + ":" : "") << " ";
}